

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::Try::finalize(Try *this)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **ppEVar2;
  Type TVar3;
  ExpressionList *__range1;
  undefined1 local_80 [8];
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  types;
  Iterator __begin1;
  
  types._M_h._M_single_bucket = (__node_base_ptr)(this->body->type).id;
  std::
  _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<wasm::Type_const*>
            ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_80,&types._M_h._M_single_bucket,&__begin1,0,
             (undefined1 *)((long)&__begin1.index + 5),(undefined1 *)((long)&__begin1.index + 6),
             (undefined1 *)((long)&__begin1.index + 7));
  std::__detail::
  _Rehash_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
             *)local_80,
            (this->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements)
  ;
  __begin1.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (this->catchBodies).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  types._M_h._M_single_bucket = (__node_base_ptr)&this->catchBodies;
  while ((__begin1.parent != pAVar1 ||
         ((ExpressionList *)types._M_h._M_single_bucket != &this->catchBodies))) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&types._M_h._M_single_bucket);
    std::__detail::
    _Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_80,&(*ppEVar2)->type);
    __begin1.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin1.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  TVar3 = wasm::Type::
          getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                    ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                      *)local_80);
  (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id = TVar3.id;
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_80);
  return;
}

Assistant:

void Try::finalize() {
  // If none of the component bodies' type is a supertype of the others, assume
  // the current type is already correct. TODO: Calculate a proper LUB.
  std::unordered_set<Type> types{body->type};
  types.reserve(catchBodies.size());
  for (auto catchBody : catchBodies) {
    types.insert(catchBody->type);
  }
  type = Type::getLeastUpperBound(types);
}